

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O0

void sscal(int n,float sa,float *x,int incx)

{
  int iVar1;
  int local_24;
  int m;
  int ix;
  int i;
  int incx_local;
  float *x_local;
  float sa_local;
  int n_local;
  
  if (0 < n) {
    if (incx == 1) {
      for (m = 0; iVar1 = n % 5, m < n % 5; m = m + 1) {
        x[m] = sa * x[m];
      }
      while (m = iVar1, m < n) {
        x[m] = sa * x[m];
        x[m + 1] = sa * x[m + 1];
        x[m + 2] = sa * x[m + 2];
        x[m + 3] = sa * x[m + 3];
        x[m + 4] = sa * x[m + 4];
        iVar1 = m + 5;
      }
    }
    else {
      if (incx < 0) {
        local_24 = (1 - n) * incx;
      }
      else {
        local_24 = 0;
      }
      for (m = 0; m < n; m = m + 1) {
        x[local_24] = sa * x[local_24];
        local_24 = local_24 + incx;
      }
    }
  }
  return;
}

Assistant:

void sscal ( int n, float sa, float x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SSCAL scales a float vector by a constant.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float SA, the multiplier.
//
//    Input/output, float X[*], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of X.
//
{
  int i;
  int ix;
  int m;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 )
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      x[i] = sa * x[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      x[i]   = sa * x[i];
      x[i+1] = sa * x[i+1];
      x[i+2] = sa * x[i+2];
      x[i+3] = sa * x[i+3];
      x[i+4] = sa * x[i+4];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    for ( i = 0; i < n; i++ )
    {
      x[ix] = sa * x[ix];
      ix = ix + incx;
    }

  }

  return;
}